

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

fdb_compact_decision
compaction_cb(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
             uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_status fVar1;
  int iVar2;
  long in_RCX;
  short *in_RDX;
  int in_ESI;
  long *in_RDI;
  fdb_doc *in_R8;
  int *in_stack_00000008;
  cb_args *args;
  fdb_compact_decision ret;
  fdb_status s;
  fdb_doc *rdoc;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  void *in_stack_ffffffffffffff60;
  uint uVar3;
  uint in_stack_ffffffffffffff74;
  fdb_doc **in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff90;
  fdb_doc *in_stack_ffffffffffffffc0;
  fdb_kvs_handle *in_stack_ffffffffffffffc8;
  
  gettimeofday((timeval *)&stack0xffffffffffffffc0,(__timezone_ptr_t)0x0);
  uVar3 = 0;
  if (in_ESI == 1) {
    *(undefined1 *)(in_stack_00000008 + 2) = 1;
  }
  else if (in_ESI == 0x10) {
    *(undefined1 *)((long)in_stack_00000008 + 9) = 1;
  }
  else if (in_ESI == 8) {
    *(undefined1 *)((long)in_stack_00000008 + 10) = 1;
  }
  else if (in_ESI == 2) {
    uVar3 = (uint)((*(byte *)(in_RCX + 0x48) & 1) != 0);
    *in_stack_00000008 = *in_stack_00000008 + 1;
    fdb_doc_create(in_stack_ffffffffffffff78,(void *)CONCAT44(in_stack_ffffffffffffff74,uVar3),
                   (size_t)in_stack_00000008,in_stack_ffffffffffffff60,0,(void *)0x10527d,
                   in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff78[6] = in_R8;
    fVar1 = fdb_get_byoffset(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x52);
      compaction_cb::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x52,
                      "fdb_compact_decision compaction_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
    }
    fdb_doc_free((fdb_doc *)0x10530e);
    if ((*(byte *)(*in_RDI + 0xb0) & 1) == 0) {
      iVar2 = memcmp(in_RDX,"default",7);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","default",in_RDX,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x58);
        compaction_cb::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x58,
                      "fdb_compact_decision compaction_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
    }
    else if (*in_RDX != 0x6264) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","db",in_RDX,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x56);
      compaction_cb::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x56,
                    "fdb_compact_decision compaction_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                   );
    }
  }
  else {
    in_stack_00000008[1] = in_stack_00000008[1] + 1;
    fdb_doc_create(in_stack_ffffffffffffff78,(void *)((ulong)in_stack_ffffffffffffff74 << 0x20),
                   (size_t)in_stack_00000008,in_stack_ffffffffffffff60,0,(void *)0x10544e,
                   in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff78[6] = in_R8;
    fVar1 = fdb_get_byoffset(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x5f);
      compaction_cb::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x5f,
                      "fdb_compact_decision compaction_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
    }
    fdb_doc_free((fdb_doc *)0x1054df);
  }
  return uVar3;
}

Assistant:

static fdb_compact_decision compaction_cb(fdb_file_handle *fhandle,
                            fdb_compaction_status status, const char *kv_name,
                            fdb_doc *doc, uint64_t old_offset,
                            uint64_t new_offset,
                            void *ctx)
{
    TEST_INIT();
    fdb_doc *rdoc;
    fdb_status s;
    fdb_compact_decision ret = FDB_CS_KEEP_DOC;
    struct cb_args *args = (struct cb_args *)ctx;

    (void) doc;
    (void) new_offset;

    if (status == FDB_CS_BEGIN) {
        args->begin = true;
    } else if (status == FDB_CS_END) {
        args->end = true;
    } else if (status == FDB_CS_FLUSH_WAL) {
        args->wal_flush = true;
    } else if (status == FDB_CS_MOVE_DOC) {
        if (doc->deleted) {
            ret = FDB_CS_DROP_DOC;
        }

        args->n_moved_docs++;
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->offset = old_offset;
        s = fdb_get_byoffset(args->handle, rdoc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);

        if (fhandle->root->config.multi_kv_instances) {
            TEST_CMP(kv_name, "db", 2);
        } else {
            TEST_CMP(kv_name, "default", 7);
        }
    } else { // FDB_CS_BATCH_MOVE
        args->n_batch_move++;
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->offset = old_offset;
        s = fdb_get_byoffset(args->handle, rdoc);
        TEST_CHK (s == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }
    return ret;
}